

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall
ImFont::RenderText(ImFont *this,ImDrawList *draw_list,float size,ImVec2 pos,ImU32 col,
                  ImVec4 *clip_rect,char *text_begin,char *text_end,float wrap_width,
                  bool cpu_fine_clip)

{
  uint *puVar1;
  ImVec2 IVar2;
  ImVec2 IVar3;
  char cVar4;
  ushort uVar5;
  uint uVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  char *pcVar10;
  int iVar11;
  size_t sVar12;
  void *pvVar13;
  char *pcVar14;
  long lVar15;
  ImFontGlyph *pIVar16;
  char *text_end_00;
  ImDrawIdx IVar17;
  char *pcVar18;
  char *in_text;
  float scale;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float in_XMM1_Dc;
  float in_XMM1_Dd;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  uint c;
  float local_c0;
  uint local_b0;
  uint local_ac;
  undefined1 local_a8 [8];
  float fStack_a0;
  float fStack_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  ulong local_80;
  ImDrawVert *local_78;
  ImDrawIdx *local_70;
  uint local_64;
  int local_60;
  int local_5c;
  float local_58;
  undefined1 local_48 [16];
  char *local_38;
  
  local_a8._0_4_ = pos.x;
  local_a8._4_4_ = pos.y;
  local_58 = wrap_width;
  if (text_end == (char *)0x0) {
    fStack_a0 = in_XMM1_Dc;
    local_a8 = (undefined1  [8])pos;
    fStack_9c = in_XMM1_Dd;
    sVar12 = strlen(text_begin);
    text_end = text_begin + sVar12;
    in_XMM1_Dc = fStack_a0;
    in_XMM1_Dd = fStack_9c;
  }
  local_98 = (float)(int)(float)local_a8._4_4_;
  fVar25 = (float)(int)(float)local_a8._4_4_;
  fVar26 = (float)(int)(float)local_a8._4_4_;
  fVar27 = (float)(int)(float)local_a8._4_4_;
  fVar28 = clip_rect->w;
  if (fVar28 < local_98) {
    return;
  }
  fStack_a0 = in_XMM1_Dc;
  fStack_9c = in_XMM1_Dd;
  scale = size / this->FontSize;
  fVar22 = this->FontSize * scale;
  fVar19 = local_98 + fVar22;
  local_48 = ZEXT416((uint)clip_rect->y);
  fStack_94 = fVar25;
  fStack_90 = fVar26;
  fStack_8c = fVar27;
  if (text_begin < text_end && (fVar19 < clip_rect->y && local_58 <= 0.0)) {
    do {
      local_98 = fVar19;
      fStack_94 = fVar25;
      fStack_90 = fVar26;
      fStack_8c = fVar27;
      pvVar13 = memchr(text_begin,10,(long)text_end - (long)text_begin);
      text_begin = (char *)((long)pvVar13 + 1);
      if (pvVar13 == (void *)0x0) {
        text_begin = text_end;
      }
      fVar25 = 0.0;
      fVar26 = 0.0;
      fVar27 = 0.0;
      fVar19 = fVar22 + local_98;
    } while ((fVar19 < (float)local_48._0_4_) && (text_begin < text_end));
  }
  text_end_00 = text_end;
  if (local_58 <= 0.0) {
    if ((((long)text_end - (long)text_begin < 0x2711) ||
        (text_end_00 = text_begin, fVar28 <= local_98)) ||
       (fVar25 = local_98, text_end <= text_begin)) goto LAB_0013174c;
    do {
      local_48._0_4_ = fVar25;
      pvVar13 = memchr(text_end_00,10,(long)text_end - (long)text_end_00);
      text_end_00 = (char *)((long)pvVar13 + 1);
      if (pvVar13 == (void *)0x0) {
        text_end_00 = text_end;
      }
    } while (((float)local_48._0_4_ + fVar22 < fVar28) &&
            (fVar25 = (float)local_48._0_4_ + fVar22, text_end_00 < text_end));
  }
LAB_0013174c:
  if (text_begin != text_end_00) {
    local_a8._4_4_ = (float)(int)(float)local_a8._4_4_;
    local_a8._0_4_ = (float)(int)(float)local_a8._0_4_;
    fStack_a0 = (float)(int)fStack_a0;
    fStack_9c = (float)(int)fStack_9c;
    iVar11 = (int)text_end_00 - (int)text_begin;
    local_60 = iVar11 * 6;
    local_5c = (draw_list->IdxBuffer).Size;
    ImDrawList::PrimReserve(draw_list,local_60,iVar11 * 4);
    local_78 = draw_list->_VtxWritePtr;
    local_70 = draw_list->_IdxWritePtr;
    local_80 = (ulong)draw_list->_VtxCurrentIdx;
    local_64 = col | 0xffffff;
    local_38 = (char *)0x0;
    local_c0 = (float)local_a8._0_4_;
    fVar28 = local_58;
    fVar25 = (float)local_a8._0_4_;
    fVar26 = (float)local_a8._0_4_;
    fVar27 = local_98;
    fVar19 = fStack_94;
    fVar20 = fStack_90;
    fVar21 = fStack_8c;
    pcVar14 = local_38;
    local_b0 = col;
    pcVar18 = text_begin;
joined_r0x001317d3:
    do {
      if (text_end_00 <= text_begin) break;
      in_text = pcVar18;
      fVar24 = local_c0;
      fVar23 = local_98;
      fVar7 = fStack_94;
      fVar8 = fStack_90;
      fVar9 = fStack_8c;
      pcVar10 = local_38;
      if (0.0 < fVar28) {
        if (pcVar14 == (char *)0x0) {
          local_48._0_4_ = fVar27;
          pcVar14 = CalcWordWrapPositionA
                              (this,scale,text_begin,text_end_00,(fVar25 - fVar26) + fVar28);
          fVar19 = 0.0;
          fVar20 = 0.0;
          fVar21 = 0.0;
          pcVar14 = pcVar14 + (pcVar14 == text_begin);
          fVar27 = (float)local_48._0_4_;
          fVar28 = local_58;
          fVar25 = (float)local_a8._0_4_;
        }
        in_text = text_begin;
        fVar24 = fVar26;
        fVar23 = fVar27;
        fVar7 = fVar19;
        fVar8 = fVar20;
        fVar9 = fVar21;
        pcVar10 = pcVar14;
        if (pcVar14 <= text_begin) {
          pcVar14 = text_begin;
          if (text_begin < text_end_00) {
            lVar15 = (long)text_end_00 - (long)text_begin;
            do {
              cVar4 = *text_begin;
              if ((cVar4 != ' ') && (cVar4 != '\t')) {
                pcVar14 = text_begin;
                if (cVar4 == '\n') {
                  pcVar14 = text_begin + 1;
                }
                break;
              }
              text_begin = text_begin + 1;
              lVar15 = lVar15 + -1;
              pcVar14 = text_end_00;
            } while (lVar15 != 0);
          }
          text_begin = pcVar14;
          fVar26 = fVar25;
          fVar27 = fVar27 + fVar22;
          pcVar14 = (char *)0x0;
          goto joined_r0x001317d3;
        }
      }
      local_38 = pcVar10;
      fStack_8c = fVar9;
      fStack_90 = fVar8;
      fStack_94 = fVar7;
      local_98 = fVar23;
      local_c0 = fVar24;
      local_ac = (uint)*in_text;
      if (*in_text < '\0') {
        iVar11 = ImTextCharFromUtf8(&local_ac,in_text,text_end_00);
        if (local_ac == 0) break;
        text_begin = in_text + iVar11;
        fVar28 = local_58;
        fVar25 = (float)local_a8._0_4_;
      }
      else {
        text_begin = in_text + 1;
      }
      fVar27 = local_98;
      fVar26 = local_c0;
      fVar19 = fStack_94;
      fVar20 = fStack_90;
      fVar21 = fStack_8c;
      pcVar14 = local_38;
      pcVar18 = text_begin;
      if (0x1f < local_ac) {
LAB_00131934:
        if (((local_ac & 0xffff) < (uint)(this->IndexLookup).Size) &&
           (uVar5 = (this->IndexLookup).Data[local_ac & 0xffff], uVar5 != 0xffff)) {
          pIVar16 = (ImFontGlyph *)(&((this->Glyphs).Data)->field_0x0 + (uint)uVar5 * 0x28);
        }
        else {
          pIVar16 = this->FallbackGlyph;
        }
        if (pIVar16 != (ImFontGlyph *)0x0) {
          fVar26 = pIVar16->AdvanceX;
          if (((((undefined1  [40])*pIVar16 & (undefined1  [40])0x2) != (undefined1  [40])0x0) &&
              (fVar24 = local_c0 + 1.0, local_c0 <= clip_rect->z)) && (clip_rect->x <= fVar24)) {
            local_b0 = local_b0 & 0xffffff | local_ac << 0x18;
            uVar6 = local_64;
            if (((undefined1  [40])*pIVar16 & (undefined1  [40])0x1) == (undefined1  [40])0x0) {
              uVar6 = local_b0;
            }
            fVar23 = local_98 + -0.5;
            IVar17 = (ImDrawIdx)local_80;
            *local_70 = IVar17;
            local_70[1] = IVar17 + 1;
            local_70[2] = IVar17 + 2;
            local_70[3] = IVar17;
            local_70[4] = IVar17 + 2;
            local_70[5] = IVar17 + 3;
            (local_78->pos).x = local_c0;
            (local_78->pos).y = fVar23;
            local_78->col = uVar6;
            IVar2.x = pIVar16->U0;
            IVar2.y = pIVar16->V0;
            local_78[1].pos.x = fVar24;
            local_78[1].pos.y = fVar23;
            local_78[1].col = uVar6;
            local_78[1].uv.y = IVar2.y;
            local_78[2].pos.x = fVar24;
            local_78[2].pos.y = fVar23;
            local_78[2].col = uVar6;
            IVar3.x = pIVar16->U1;
            IVar3.y = pIVar16->V1;
            local_78->uv = IVar2;
            local_78[1].uv.x = IVar3.x;
            local_78[2].uv = IVar3;
            local_78[3].pos.x = local_c0;
            local_78[3].pos.y = fVar23;
            local_78[3].col = uVar6;
            local_78[3].uv.x = IVar2.x;
            local_78[3].uv.y = IVar3.y;
            local_78 = local_78 + 4;
            local_80 = (ulong)((int)local_80 + 4);
            local_70 = local_70 + 6;
          }
          fVar26 = local_c0 + fVar26 * scale;
          local_c0 = fVar26;
        }
        goto joined_r0x001317d3;
      }
      if (local_ac != 10) {
        if (local_ac != 0xd) goto LAB_00131934;
        goto joined_r0x001317d3;
      }
      local_98 = local_98 + fVar22;
      fVar26 = fVar25;
      fVar27 = local_98;
      local_c0 = fVar25;
    } while (local_98 < clip_rect->w || local_98 == clip_rect->w);
    (draw_list->VtxBuffer).Size =
         (int)((ulong)((long)local_78 - (long)(draw_list->VtxBuffer).Data) >> 2) * -0x33333333;
    iVar11 = (int)((ulong)((long)local_70 - (long)(draw_list->IdxBuffer).Data) >> 1);
    (draw_list->IdxBuffer).Size = iVar11;
    puVar1 = &(draw_list->CmdBuffer).Data[(long)(draw_list->CmdBuffer).Size + -1].ElemCount;
    *puVar1 = *puVar1 + (iVar11 - (local_5c + local_60));
    draw_list->_VtxWritePtr = local_78;
    draw_list->_IdxWritePtr = local_70;
    draw_list->_VtxCurrentIdx = (uint)local_80;
  }
  return;
}

Assistant:

void ImFont::RenderText(ImDrawList* draw_list, float size, ImVec2 pos, ImU32 col, const ImVec4& clip_rect, const char* text_begin, const char* text_end, float wrap_width, bool cpu_fine_clip) const
{
    if (!text_end)
        text_end = text_begin + strlen(text_begin); // ImGui:: functions generally already provides a valid text_end, so this is merely to handle direct calls.

    // Align to be pixel perfect
    pos.x = IM_FLOOR(pos.x);
    pos.y = IM_FLOOR(pos.y);
    float x = pos.x;
    float y = pos.y;
    if (y > clip_rect.w)
        return;

    const float scale = size / FontSize;
    const float line_height = FontSize * scale;
    const bool word_wrap_enabled = (wrap_width > 0.0f);
    const char* word_wrap_eol = NULL;

    // Fast-forward to first visible line
    const char* s = text_begin;
    if (y + line_height < clip_rect.y && !word_wrap_enabled)
        while (y + line_height < clip_rect.y && s < text_end)
        {
            s = (const char*)memchr(s, '\n', text_end - s);
            s = s ? s + 1 : text_end;
            y += line_height;
        }

    // For large text, scan for the last visible line in order to avoid over-reserving in the call to PrimReserve()
    // Note that very large horizontal line will still be affected by the issue (e.g. a one megabyte string buffer without a newline will likely crash atm)
    if (text_end - s > 10000 && !word_wrap_enabled)
    {
        const char* s_end = s;
        float y_end = y;
        while (y_end < clip_rect.w && s_end < text_end)
        {
            s_end = (const char*)memchr(s_end, '\n', text_end - s_end);
            s_end = s_end ? s_end + 1 : text_end;
            y_end += line_height;
        }
        text_end = s_end;
    }
    if (s == text_end)
        return;

    // Reserve vertices for remaining worse case (over-reserving is useful and easily amortized)
    const int vtx_count_max = (int)(text_end - s) * 4;
    const int idx_count_max = (int)(text_end - s) * 6;
    const int idx_expected_size = draw_list->IdxBuffer.Size + idx_count_max;
    draw_list->PrimReserve(idx_count_max, vtx_count_max);

    ImDrawVert* vtx_write = draw_list->_VtxWritePtr;
    ImDrawIdx* idx_write = draw_list->_IdxWritePtr;
    unsigned int vtx_current_idx = draw_list->_VtxCurrentIdx;

    const ImU32 col_untinted = col | ~IM_COL32_A_MASK;

    while (s < text_end)
    {
        if (word_wrap_enabled)
        {
            // Calculate how far we can render. Requires two passes on the string data but keeps the code simple and not intrusive for what's essentially an uncommon feature.
            if (!word_wrap_eol)
            {
                word_wrap_eol = CalcWordWrapPositionA(scale, s, text_end, wrap_width - (x - pos.x));
                if (word_wrap_eol == s) // Wrap_width is too small to fit anything. Force displaying 1 character to minimize the height discontinuity.
                    word_wrap_eol++;    // +1 may not be a character start point in UTF-8 but it's ok because we use s >= word_wrap_eol below
            }

            if (s >= word_wrap_eol)
            {
                x = pos.x;
                y += line_height;
                word_wrap_eol = NULL;

                // Wrapping skips upcoming blanks
                while (s < text_end)
                {
                    const char c = *s;
                    if (ImCharIsBlankA(c)) { s++; } else if (c == '\n') { s++; break; } else { break; }
                }
                continue;
            }
        }

        // Decode and advance source
        unsigned int c = (unsigned int)*s;
        if (c < 0x80)
        {
            s += 1;
        }
        else
        {
            s += ImTextCharFromUtf8(&c, s, text_end);
            if (c == 0) // Malformed UTF-8?
                break;
        }

        if (c < 32)
        {
            if (c == '\n')
            {
                x = pos.x;
                y += line_height;
                if (y > clip_rect.w)
                    break; // break out of main loop
                continue;
            }
            if (c == '\r')
                continue;
        }

        const ImFontGlyph* glyph = FindGlyph((ImWchar)c);
        if (glyph == NULL)
            continue;

        float char_width = glyph->AdvanceX * scale;
        if (glyph->Visible)
        {
            // We don't do a second finer clipping test on the Y axis as we've already skipped anything before clip_rect.y and exit once we pass clip_rect.w
            float x1 = x;
            float x2 = x + 1.0;
            float y1 = y - 0.5f;
            float y2 = y - 0.5f;
            if (x1 <= clip_rect.z && x2 >= clip_rect.x)
            {
                // Render a character
                float u1 = glyph->U0;
                float v1 = glyph->V0;
                float u2 = glyph->U1;
                float v2 = glyph->V1;

                // CPU side clipping used to fit text in their frame when the frame is too small. Only does clipping for axis aligned quads.
                if (false && cpu_fine_clip)
                {
                    if (x1 < clip_rect.x)
                    {
                        u1 = u1 + (1.0f - (x2 - clip_rect.x) / (x2 - x1)) * (u2 - u1);
                        x1 = clip_rect.x;
                    }
                    if (y1 < clip_rect.y)
                    {
                        v1 = v1 + (1.0f - (y2 - clip_rect.y) / (y2 - y1)) * (v2 - v1);
                        y1 = clip_rect.y;
                    }
                    if (x2 > clip_rect.z)
                    {
                        u2 = u1 + ((clip_rect.z - x1) / (x2 - x1)) * (u2 - u1);
                        x2 = clip_rect.z;
                    }
                    if (y2 > clip_rect.w)
                    {
                        v2 = v1 + ((clip_rect.w - y1) / (y2 - y1)) * (v2 - v1);
                        y2 = clip_rect.w;
                    }
                    if (y1 >= y2)
                    {
                        x += char_width;
                        continue;
                    }
                }

                col &= 0x00FFFFFF;
                col |= (c << 24);
                // Support for untinted glyphs
                ImU32 glyph_col = glyph->Colored ? col_untinted : col;

                // We are NOT calling PrimRectUV() here because non-inlined causes too much overhead in a debug builds. Inlined here:
                {
                    idx_write[0] = (ImDrawIdx)(vtx_current_idx); idx_write[1] = (ImDrawIdx)(vtx_current_idx+1); idx_write[2] = (ImDrawIdx)(vtx_current_idx+2);
                    idx_write[3] = (ImDrawIdx)(vtx_current_idx); idx_write[4] = (ImDrawIdx)(vtx_current_idx+2); idx_write[5] = (ImDrawIdx)(vtx_current_idx+3);
                    vtx_write[0].pos.x = x1; vtx_write[0].pos.y = y1; vtx_write[0].col = glyph_col; vtx_write[0].uv.x = u1; vtx_write[0].uv.y = v1;
                    vtx_write[1].pos.x = x2; vtx_write[1].pos.y = y1; vtx_write[1].col = glyph_col; vtx_write[1].uv.x = u2; vtx_write[1].uv.y = v1;
                    vtx_write[2].pos.x = x2; vtx_write[2].pos.y = y2; vtx_write[2].col = glyph_col; vtx_write[2].uv.x = u2; vtx_write[2].uv.y = v2;
                    vtx_write[3].pos.x = x1; vtx_write[3].pos.y = y2; vtx_write[3].col = glyph_col; vtx_write[3].uv.x = u1; vtx_write[3].uv.y = v2;
                    vtx_write += 4;
                    vtx_current_idx += 4;
                    idx_write += 6;
                }
            }
        }
        x += char_width;
    }

    // Give back unused vertices (clipped ones, blanks) ~ this is essentially a PrimUnreserve() action.
    draw_list->VtxBuffer.Size = (int)(vtx_write - draw_list->VtxBuffer.Data); // Same as calling shrink()
    draw_list->IdxBuffer.Size = (int)(idx_write - draw_list->IdxBuffer.Data);
    draw_list->CmdBuffer[draw_list->CmdBuffer.Size - 1].ElemCount -= (idx_expected_size - draw_list->IdxBuffer.Size);
    draw_list->_VtxWritePtr = vtx_write;
    draw_list->_IdxWritePtr = idx_write;
    draw_list->_VtxCurrentIdx = vtx_current_idx;
}